

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

int Jf_TtComputeForCut(Jf_Man_t *p,int iFuncLit0,int iFuncLit1,int *pCut0,int *pCut1,int *pCutOut)

{
  Vec_Mem_t *pVVar1;
  int nWords_00;
  int iVar2;
  int iVar3;
  uint fCompl_00;
  int iVar4;
  word *pIn;
  word *pIn_00;
  word *pTruth1;
  word *pTruth0;
  int nWords;
  int LutSize;
  int truthId;
  int fCompl;
  word uTruth1 [4];
  word uTruth0 [4];
  word uTruth [4];
  int *pCutOut_local;
  int *pCut1_local;
  int *pCut0_local;
  int iFuncLit1_local;
  int iFuncLit0_local;
  Jf_Man_t *p_local;
  
  iVar4 = p->pPars->nLutSize;
  nWords_00 = Abc_Truth6WordNum(p->pPars->nLutSize);
  pVVar1 = p->vTtMem;
  iVar2 = Abc_Lit2Var(iFuncLit0);
  pIn = Vec_MemReadEntry(pVVar1,iVar2);
  pVVar1 = p->vTtMem;
  iVar2 = Abc_Lit2Var(iFuncLit1);
  pIn_00 = Vec_MemReadEntry(pVVar1,iVar2);
  iVar2 = Abc_LitIsCompl(iFuncLit0);
  Abc_TtCopy(uTruth1 + 3,pIn,nWords_00,iVar2);
  iVar2 = Abc_LitIsCompl(iFuncLit1);
  Abc_TtCopy((word *)&truthId,pIn_00,nWords_00,iVar2);
  iVar2 = Jf_CutSize(pCut0);
  iVar3 = Jf_CutSize(pCutOut);
  Abc_TtExpand(uTruth1 + 3,iVar4,pCut0 + 1,iVar2,pCutOut + 1,iVar3);
  iVar2 = Jf_CutSize(pCut1);
  iVar3 = Jf_CutSize(pCutOut);
  Abc_TtExpand((word *)&truthId,iVar4,pCut1 + 1,iVar2,pCutOut + 1,iVar3);
  fCompl_00 = (uint)uTruth1[3] & truthId & 1;
  Abc_TtAnd(uTruth0 + 3,uTruth1 + 3,(word *)&truthId,nWords_00,fCompl_00);
  iVar4 = Abc_TtMinBase(uTruth0 + 3,pCutOut + 1,*pCutOut,iVar4);
  *pCutOut = iVar4;
  if ((uTruth0[3] & 1) == 0) {
    iVar4 = Vec_MemHashInsert(p->vTtMem,uTruth0 + 3);
    iVar4 = Abc_Var2Lit(iVar4,fCompl_00);
    return iVar4;
  }
  __assert_fail("(uTruth[0] & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                ,0x43b,"int Jf_TtComputeForCut(Jf_Man_t *, int, int, int *, int *, int *)");
}

Assistant:

int Jf_TtComputeForCut( Jf_Man_t * p, int iFuncLit0, int iFuncLit1, int * pCut0, int * pCut1, int * pCutOut )
{
    word uTruth[JF_WORD_MAX], uTruth0[JF_WORD_MAX], uTruth1[JF_WORD_MAX];
    int fCompl, truthId;
    int LutSize    = p->pPars->nLutSize;
    int nWords     = Abc_Truth6WordNum(p->pPars->nLutSize);
    word * pTruth0 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit0));
    word * pTruth1 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit1));
    Abc_TtCopy( uTruth0, pTruth0, nWords, Abc_LitIsCompl(iFuncLit0) );
    Abc_TtCopy( uTruth1, pTruth1, nWords, Abc_LitIsCompl(iFuncLit1) );
    Abc_TtExpand( uTruth0, LutSize, pCut0 + 1, Jf_CutSize(pCut0), pCutOut + 1, Jf_CutSize(pCutOut) );
    Abc_TtExpand( uTruth1, LutSize, pCut1 + 1, Jf_CutSize(pCut1), pCutOut + 1, Jf_CutSize(pCutOut) );
    fCompl         = (int)(uTruth0[0] & uTruth1[0] & 1);
    Abc_TtAnd( uTruth, uTruth0, uTruth1, nWords, fCompl );
    pCutOut[0]     = Abc_TtMinBase( uTruth, pCutOut + 1, pCutOut[0], LutSize );
    assert( (uTruth[0] & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, uTruth);
    return Abc_Var2Lit( truthId, fCompl );
}